

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10f1ef::CpuImmediateTest_sbc_carry_and_overflow_Test::
~CpuImmediateTest_sbc_carry_and_overflow_Test(CpuImmediateTest_sbc_carry_and_overflow_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuImmediateTest, sbc_carry_and_overflow) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.p = V_FLAG | C_FLAG;
    expected.a = 0x60;
    memory_content = 0x70;

    run_instruction(SBC_IMM);
}